

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  pointer *pppTVar1;
  pointer __dest;
  pointer ppTVar2;
  long lVar3;
  size_t __n;
  pointer __src;
  
  __dest = (this->listeners_).
           super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)ppTVar2 - (long)__dest;
  if (__n != 0) {
    lVar3 = ((long)__n >> 3) + (ulong)((long)__n >> 3 == 0);
    do {
      __src = __dest + 1;
      __n = __n - 8;
      if (*__dest == listener) {
        if (__src != ppTVar2) {
          memmove(__dest,__src,__n);
        }
        pppTVar1 = &(this->listeners_).
                    super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + -1;
        return listener;
      }
      lVar3 = lVar3 + -1;
      __dest = __src;
    } while (lVar3 != 0);
  }
  return (TestEventListener *)0x0;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener *listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + i);
      return listener;
    }
  }

  return NULL;
}